

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O3

bool __thiscall deqp::gls::isTessellationPresent(gls *this,ShaderCaseSpecification *spec)

{
  uint uVar1;
  ulong uVar2;
  gls *pgVar3;
  bool bVar4;
  
  if (this[200] == (gls)0x1) {
    uVar1 = (int)((long)spec - (long)this >> 4) * -0x11111111;
    if ((int)uVar1 < 1) {
      return false;
    }
    uVar2 = (ulong)(uVar1 & 0x7fffffff);
    pgVar3 = this + 0xe8;
    do {
      uVar2 = uVar2 - 1;
      bVar4 = ((byte)*pgVar3 & 0x18) != 0;
      if (bVar4) {
        return bVar4;
      }
      pgVar3 = pgVar3 + 0xf0;
    } while (uVar2 != 0);
  }
  else {
    bVar4 = true;
    if (*(long *)(this + 0x48) == *(long *)(this + 0x50)) {
      return *(long *)(this + 0x60) != *(long *)(this + 0x68);
    }
  }
  return bVar4;
}

Assistant:

static bool isTessellationPresent (const ShaderCaseSpecification& spec)
{
	if (spec.programs[0].sources.separable)
	{
		const deUint32 tessellationBits =	(1 << glu::SHADERTYPE_TESSELLATION_CONTROL)		|
											(1 << glu::SHADERTYPE_TESSELLATION_EVALUATION);

		for (int programNdx = 0; programNdx < (int)spec.programs.size(); ++programNdx)
			if (spec.programs[programNdx].activeStages & tessellationBits)
				return true;
		return false;
	}
	else
		return !spec.programs[0].sources.sources[glu::SHADERTYPE_TESSELLATION_CONTROL].empty() ||
			   !spec.programs[0].sources.sources[glu::SHADERTYPE_TESSELLATION_EVALUATION].empty();
}